

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O3

Float __thiscall
pbrt::PaddedSobolSampler::SampleDimension
          (PaddedSobolSampler *this,int dimension,uint32_t a,uint32_t hash)

{
  uint uVar1;
  uint *puVar2;
  ulong uVar3;
  uint32_t uVar4;
  bool bVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 in_ZMM0 [64];
  undefined1 in_XMM2 [16];
  OwenScrambler local_4;
  
  switch(this->randomizeStrategy) {
  case None:
    if (a == 0) {
      auVar7 = ZEXT816(0) << 0x40;
      goto LAB_002693bc;
    }
    uVar1 = 0;
    puVar2 = &SobolMatrices32 + dimension * 0x34;
    uVar3 = (ulong)a;
    do {
      if ((uVar3 & 1) != 0) {
        uVar1 = uVar1 ^ *puVar2;
      }
      puVar2 = puVar2 + 1;
      bVar5 = 1 < uVar3;
      uVar3 = uVar3 >> 1;
    } while (bVar5);
    auVar7 = vcvtusi2ss_avx512f(in_ZMM0._0_16_,uVar1);
    fVar6 = auVar7._0_4_;
    goto LAB_002693b4;
  default:
    LogFatal(Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/samplers.h"
             ,0xed,"Unhandled randomization strategy");
  case PermuteDigits:
    if (a == 0) {
      uVar1 = 0;
    }
    else {
      uVar1 = 0;
      puVar2 = &SobolMatrices32 + dimension * 0x34;
      uVar3 = (ulong)a;
      do {
        if ((uVar3 & 1) != 0) {
          uVar1 = uVar1 ^ *puVar2;
        }
        puVar2 = puVar2 + 1;
        bVar5 = 1 < uVar3;
        uVar3 = uVar3 >> 1;
      } while (bVar5);
    }
    uVar4 = uVar1 ^ hash;
    break;
  case FastOwen:
    if (a != 0) {
      uVar3 = (ulong)a;
      do {
        bVar5 = 1 < uVar3;
        uVar3 = uVar3 >> 1;
      } while (bVar5);
    }
    halt_baddata();
  case Owen:
    if (a == 0) {
      uVar4 = 0;
    }
    else {
      uVar4 = 0;
      puVar2 = &SobolMatrices32 + dimension * 0x34;
      uVar3 = (ulong)a;
      do {
        if ((uVar3 & 1) != 0) {
          uVar4 = uVar4 ^ *puVar2;
        }
        puVar2 = puVar2 + 1;
        bVar5 = 1 < uVar3;
        uVar3 = uVar3 >> 1;
      } while (bVar5);
    }
    uVar4 = OwenScrambler::operator()(&local_4,uVar4);
  }
  auVar7 = vcvtusi2ss_avx512f(in_XMM2,uVar4);
  fVar6 = auVar7._0_4_;
LAB_002693b4:
  auVar7 = ZEXT416((uint)(fVar6 * 2.3283064e-10));
LAB_002693bc:
  auVar7 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar7);
  return auVar7._0_4_;
}

Assistant:

PBRT_CPU_GPU
    Float SampleDimension(int dimension, uint32_t a, uint32_t hash) const {
        switch (randomizeStrategy) {
        case RandomizeStrategy::None:
            return SobolSample(a, dimension, NoRandomizer());
        case RandomizeStrategy::PermuteDigits:
            return SobolSample(a, dimension, BinaryPermuteScrambler(hash));
        case RandomizeStrategy::FastOwen:
            return SobolSample(a, dimension, FastOwenScrambler(hash));
        case RandomizeStrategy::Owen:
            return SobolSample(a, dimension, OwenScrambler(hash));
        default:
            LOG_FATAL("Unhandled randomization strategy");
            return {};
        }
    }